

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

void mxx::impl::distribute_container<std::vector<int,_std::allocator<int>_>_>::distribute_inplace
               (vector<int,_std::allocator<int>_> *c,comm *comm)

{
  size_t sVar1;
  comm *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  unsigned_long uVar6;
  iterator begin;
  iterator end;
  iterator out;
  iterator __first;
  iterator __last;
  long lVar7;
  reference piVar8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_120;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_118;
  unsigned_long *local_110;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_108;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_100;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_f8;
  unsigned_long *local_f0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_e8;
  undefined1 local_e0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  undefined1 local_a0 [8];
  vector<long,_std::allocator<long>_> surpluses;
  signed_size_t surplus;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> result;
  undefined1 local_40 [8];
  block_decomposition<unsigned_long> part;
  size_t total_size;
  size_t local_size;
  comm *comm_local;
  vector<int,_std::allocator<int>_> *c_local;
  
  local_size = (size_t)comm;
  comm_local = (comm *)c;
  iVar4 = mxx::comm::size(comm);
  if (iVar4 != 1) {
    total_size = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)comm_local);
    uVar6 = allreduce<unsigned_long>(&total_size,(comm *)local_size);
    part._16_8_ = uVar6;
    iVar4 = mxx::comm::size((comm *)local_size);
    iVar5 = mxx::comm::rank((comm *)local_size);
    partition::block_decomposition<unsigned_long>::block_decomposition
              ((block_decomposition<unsigned_long> *)local_40,uVar6,iVar4,iVar5);
    bVar3 = any_of(total_size == part._16_8_,(comm *)local_size);
    sVar1 = total_size;
    if (bVar3) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_68);
      uVar6 = partition::block_decomposition<unsigned_long>::local_size
                        ((block_decomposition<unsigned_long> *)local_40);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)local_68,uVar6);
      begin = std::begin<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)comm_local);
      end = std::end<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)comm_local);
      out = std::begin<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)local_68);
      distribute_scatter<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)begin._M_current
                 ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)end._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)out._M_current,
                 part._16_8_,(comm *)local_size);
      std::vector<int,_std::allocator<int>_>::swap
                ((vector<int,_std::allocator<int>_> *)comm_local,
                 (vector<int,_std::allocator<int>_> *)local_68);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68)
      ;
    }
    else {
      uVar6 = partition::block_decomposition<unsigned_long>::local_size
                        ((block_decomposition<unsigned_long> *)local_40);
      surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)(sVar1 - uVar6);
      allgather<long>((vector<long,_std::allocator<long>_> *)local_a0,
                      (long *)&surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(comm *)local_size);
      __first = std::vector<long,_std::allocator<long>_>::begin
                          ((vector<long,_std::allocator<long>_> *)local_a0);
      __last = std::vector<long,_std::allocator<long>_>::end
                         ((vector<long,_std::allocator<long>_> *)local_a0);
      lVar7 = std::
              accumulate<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                        ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                         __first._M_current,
                         (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                         __last._M_current,0);
      if (lVar7 != 0) {
        assert_fail("std::accumulate(surpluses.begin(), surpluses.end(), (impl::signed_size_t)0) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                    ,0x13f,"distribute_inplace");
      }
      iVar4 = mxx::comm::size((comm *)local_size);
      iVar5 = mxx::comm::rank((comm *)local_size);
      surplus_send_pairing
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<long,_std::allocator<long>_> *)local_a0,iVar4,iVar5,false);
      all2all<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e0,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(comm *)local_size);
      if ((long)surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage < 1) {
        local_108._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &recv_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        local_110 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &recv_counts.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        uVar6 = std::
                accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                          (local_108,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )local_110,0);
        if (uVar6 != 0) {
          assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), (size_t)0) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                      ,0x14b,"distribute_inplace");
        }
        pcVar2 = comm_local;
        uVar6 = partition::block_decomposition<unsigned_long>::local_size
                          ((block_decomposition<unsigned_long> *)local_40);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)pcVar2,uVar6);
        local_120._M_current =
             (int *)std::begin<std::vector<int,std::allocator<int>>>
                              ((vector<int,_std::allocator<int>_> *)comm_local);
        local_118 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(&local_120,total_size);
        piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_118);
        all2allv<int>((int *)0x0,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,piVar8,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e0,
                      (comm *)local_size);
      }
      else {
        local_e8._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e0);
        local_f0 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e0);
        uVar6 = std::
                accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                          (local_e8,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     )local_f0,0);
        if (uVar6 != 0) {
          assert_fail("std::accumulate(recv_counts.begin(), recv_counts.end(), (size_t)0) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                      ,0x146,"distribute_inplace");
        }
        local_100._M_current =
             (int *)std::begin<std::vector<int,std::allocator<int>>>
                              ((vector<int,_std::allocator<int>_> *)comm_local);
        local_f8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator+(&local_100,
                             total_size -
                             (long)surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage);
        piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_f8);
        all2allv<int>(piVar8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &recv_counts.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(int *)0x0,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e0,
                      (comm *)local_size);
        pcVar2 = comm_local;
        uVar6 = partition::block_decomposition<unsigned_long>::local_size
                          ((block_decomposition<unsigned_long> *)local_40);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)pcVar2,uVar6);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)local_a0);
    }
    partition::block_decomposition<unsigned_long>::~block_decomposition
              ((block_decomposition<unsigned_long> *)local_40);
  }
  return;
}

Assistant:

inline static void distribute_inplace(Container& c, const mxx::comm& comm) {
        // custom implementation: don't need full sized buffers, only for receiving surpluses)
        // if single process, don't do anything
        if (comm.size() == 1)
            return;

        typedef typename std::iterator_traits<decltype(std::begin(c))>::value_type T;

        // get sizes
        size_t local_size = c.size();
        size_t total_size = mxx::allreduce(local_size, comm);
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());

        if (mxx::any_of(local_size == total_size, comm)) {
            // use scatterv instead of all2all based communication
            Container result;
            result.resize(part.local_size());
            impl::distribute_scatter(std::begin(c), std::end(c), std::begin(result), total_size, comm);
            c.swap(result);
        } else {
            // use surplus send-pairing to minimize total communication volume
            // TODO: use all2all or send/recv depending on the maximum number of
            //       paired processes

            // get surplus
            impl::signed_size_t surplus = (impl::signed_size_t)local_size - (impl::signed_size_t)part.local_size();

            // allgather surpluses
            // TODO figure out how to do surplus send pairing without requiring allgather
            std::vector<impl::signed_size_t> surpluses = mxx::allgather(surplus, comm);
            MXX_ASSERT(std::accumulate(surpluses.begin(), surpluses.end(), (impl::signed_size_t)0) == 0);

            // get send counts
            std::vector<size_t> send_counts = impl::surplus_send_pairing(surpluses, comm.size(), comm.rank(), false);
            std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);

            if (surplus > 0) {
                MXX_ASSERT(std::accumulate(recv_counts.begin(), recv_counts.end(), (size_t)0) == 0);
                // TODO: use iterators not pointers
                mxx::all2allv(&(*(std::begin(c)+((impl::signed_size_t)local_size-surplus))), send_counts, (T*)nullptr, recv_counts, comm);
                c.resize(part.local_size());
            } else {
                MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), (size_t)0) == 0);
                c.resize(part.local_size());
                mxx::all2allv((T*)nullptr, send_counts, &(*(std::begin(c)+local_size)), recv_counts, comm);
            }
        }
    }